

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parse_path.cpp
# Opt level: O2

void duckdb::ParseDirpathFunction(DataChunk *args,ExpressionState *state,Vector *result)

{
  ValidityMask *this;
  VectorType VVar1;
  unsigned_long *puVar2;
  anon_union_16_2_67f50693_for_value *paVar3;
  data_ptr_t pdVar4;
  long *plVar5;
  reference vector;
  ulong uVar6;
  ulong uVar7;
  idx_t iVar8;
  ulong uVar9;
  ulong uVar10;
  ulong uVar11;
  long lVar12;
  ulong uVar13;
  idx_t iVar14;
  ValidityMask *in_R9;
  ulong uVar15;
  idx_t row_idx;
  data_ptr_t pdVar16;
  ulong uVar17;
  bool bVar18;
  anon_struct_16_3_d7536bce_for_pointer aVar19;
  string_t sVar20;
  string_t left;
  string_t left_00;
  string_t left_01;
  string_t left_02;
  string_t left_03;
  string_t left_04;
  string_t left_05;
  string_t right;
  string_t right_00;
  string_t right_01;
  string_t right_02;
  string_t right_03;
  string_t right_04;
  string_t right_05;
  string_t right_06;
  idx_t in_stack_fffffffffffffe28;
  idx_t count;
  UnifiedVectorFormat ldata;
  Vector separator;
  UnifiedVectorFormat local_f0;
  Vector trim_extension;
  anon_union_16_2_67f50693_for_value local_40;
  
  vector = vector<duckdb::Vector,_true>::get<true>(&args->data,0);
  string_t::string_t((string_t *)&local_40.pointer,"default");
  Value::Value((Value *)&trim_extension,(string_t)local_40);
  Vector::Vector(&separator,(Value *)&trim_extension);
  Value::~Value((Value *)&trim_extension);
  Value::Value((Value *)&ldata,0);
  Vector::Vector(&trim_extension,(Value *)&ldata);
  Value::~Value((Value *)&ldata);
  ldata.sel._0_1_ = 1;
  ReadOptionalArgs(args,&separator,&trim_extension,(bool *)&ldata);
  VVar1 = vector->vector_type;
  if ((VVar1 ^ CONSTANT_VECTOR) == FLAT_VECTOR &&
      (separator.vector_type ^ CONSTANT_VECTOR) == FLAT_VECTOR) {
    Vector::SetVectorType(result,CONSTANT_VECTOR);
    puVar2 = (vector->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask;
    paVar3 = (anon_union_16_2_67f50693_for_value *)result->data;
    if (((puVar2 == (unsigned_long *)0x0) || ((*puVar2 & 1) != 0)) &&
       ((separator.validity.super_TemplatedValidityMask<unsigned_long>.validity_mask ==
         (unsigned_long *)0x0 ||
        ((*separator.validity.super_TemplatedValidityMask<unsigned_long>.validity_mask & 1) != 0))))
    {
      aVar19 = (anon_struct_16_3_d7536bce_for_pointer)
               BinaryLambdaWrapper::
               Operation<duckdb::ParseDirpathFunction(duckdb::DataChunk&,duckdb::ExpressionState&,duckdb::Vector&)::__0,bool,duckdb::string_t,duckdb::string_t,duckdb::string_t>
                         ((anon_class_8_1_6971b95b)result,
                          (string_t)((anon_union_16_2_67f50693_for_value *)vector->data)->pointer,
                          *(anon_union_16_2_67f50693_for_value *)separator.data,in_R9,
                          in_stack_fffffffffffffe28);
      paVar3->pointer = aVar19;
      goto LAB_00d55a62;
    }
  }
  else {
    count = args->count;
    if ((separator.vector_type ^ CONSTANT_VECTOR) == FLAT_VECTOR && VVar1 == FLAT_VECTOR) {
      pdVar16 = vector->data;
      if ((separator.validity.super_TemplatedValidityMask<unsigned_long>.validity_mask ==
           (unsigned_long *)0x0) ||
         ((*separator.validity.super_TemplatedValidityMask<unsigned_long>.validity_mask & 1) != 0))
      {
        Vector::SetVectorType(result,FLAT_VECTOR);
        pdVar4 = result->data;
        FlatVector::VerifyFlatVector(result);
        FlatVector::VerifyFlatVector(vector);
        FlatVector::SetValidity(result,&vector->validity);
        if ((result->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask ==
            (unsigned_long *)0x0) {
          lVar12 = 8;
          while (bVar18 = count != 0, count = count - 1, bVar18) {
            left_02.value.pointer.ptr = (char *)*(undefined8 *)(pdVar16 + lVar12);
            left_02.value._0_8_ = *(undefined8 *)(pdVar16 + lVar12 + -8);
            sVar20 = BinaryLambdaWrapper::
                     Operation<duckdb::ParseDirpathFunction(duckdb::DataChunk&,duckdb::ExpressionState&,duckdb::Vector&)::__0,bool,duckdb::string_t,duckdb::string_t,duckdb::string_t>
                               ((anon_class_8_1_6971b95b)result,left_02,
                                (string_t)*(anon_union_16_2_67f50693_for_value *)separator.data,
                                in_R9,count);
            *(long *)(pdVar4 + lVar12 + -8) = sVar20.value._0_8_;
            *(long *)(pdVar4 + lVar12) = sVar20.value._8_8_;
            lVar12 = lVar12 + 0x10;
          }
        }
        else {
          uVar6 = count + 0x3f;
          uVar17 = 0;
          for (uVar9 = 0; uVar9 != uVar6 >> 6; uVar9 = uVar9 + 1) {
            puVar2 = (result->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask;
            if (puVar2 == (unsigned_long *)0x0) {
              uVar13 = uVar17 + 0x40;
              if (count <= uVar17 + 0x40) {
                uVar13 = count;
              }
LAB_00d55961:
              uVar10 = uVar17 << 4 | 8;
              for (; uVar7 = uVar17, uVar17 < uVar13; uVar17 = uVar17 + 1) {
                left.value.pointer.ptr = (char *)*(undefined8 *)(pdVar16 + uVar10);
                left.value._0_8_ = *(undefined8 *)(pdVar16 + (uVar10 - 8));
                sVar20 = BinaryLambdaWrapper::
                         Operation<duckdb::ParseDirpathFunction(duckdb::DataChunk&,duckdb::ExpressionState&,duckdb::Vector&)::__0,bool,duckdb::string_t,duckdb::string_t,duckdb::string_t>
                                   ((anon_class_8_1_6971b95b)result,left,
                                    (string_t)*(anon_union_16_2_67f50693_for_value *)separator.data,
                                    in_R9,count);
                *(long *)(pdVar4 + (uVar10 - 8)) = sVar20.value._0_8_;
                *(long *)(pdVar4 + uVar10) = sVar20.value._8_8_;
                uVar10 = uVar10 + 0x10;
              }
            }
            else {
              uVar10 = puVar2[uVar9];
              uVar13 = uVar17 + 0x40;
              if (count <= uVar17 + 0x40) {
                uVar13 = count;
              }
              if (uVar10 == 0xffffffffffffffff) goto LAB_00d55961;
              uVar7 = uVar13;
              if (uVar10 != 0) {
                uVar11 = uVar17 << 4 | 8;
                for (uVar15 = 0; uVar7 = uVar17 + uVar15, uVar17 + uVar15 < uVar13;
                    uVar15 = uVar15 + 1) {
                  if ((uVar10 >> (uVar15 & 0x3f) & 1) != 0) {
                    left_00.value.pointer.ptr = (char *)*(undefined8 *)(pdVar16 + uVar11);
                    left_00.value._0_8_ = *(undefined8 *)(pdVar16 + (uVar11 - 8));
                    sVar20 = BinaryLambdaWrapper::
                             Operation<duckdb::ParseDirpathFunction(duckdb::DataChunk&,duckdb::ExpressionState&,duckdb::Vector&)::__0,bool,duckdb::string_t,duckdb::string_t,duckdb::string_t>
                                       ((anon_class_8_1_6971b95b)result,left_00,
                                        (string_t)
                                        *(anon_union_16_2_67f50693_for_value *)separator.data,in_R9,
                                        count);
                    *(long *)(pdVar4 + (uVar11 - 8)) = sVar20.value._0_8_;
                    *(long *)(pdVar4 + uVar11) = sVar20.value._8_8_;
                  }
                  uVar11 = uVar11 + 0x10;
                }
              }
            }
            uVar17 = uVar7;
          }
        }
        goto LAB_00d55a62;
      }
    }
    else {
      if ((VVar1 ^ CONSTANT_VECTOR) != FLAT_VECTOR || separator.vector_type != FLAT_VECTOR) {
        if (separator.vector_type == FLAT_VECTOR && VVar1 == FLAT_VECTOR) {
          pdVar16 = vector->data;
          Vector::SetVectorType(result,FLAT_VECTOR);
          pdVar4 = result->data;
          FlatVector::VerifyFlatVector(result);
          FlatVector::VerifyFlatVector(vector);
          FlatVector::SetValidity(result,&vector->validity);
          FlatVector::VerifyFlatVector(&separator);
          this = &result->validity;
          ValidityMask::Combine(this,&separator.validity,count);
          if ((this->super_TemplatedValidityMask<unsigned_long>).validity_mask ==
              (unsigned_long *)0x0) {
            lVar12 = 8;
            while (bVar18 = count != 0, count = count - 1, bVar18) {
              sVar20.value.pointer.ptr = (char *)*(undefined8 *)(pdVar16 + lVar12);
              sVar20.value._0_8_ = *(undefined8 *)(pdVar16 + lVar12 + -8);
              right_06.value.pointer.ptr = (char *)*(undefined8 *)(separator.data + lVar12);
              right_06.value._0_8_ = *(undefined8 *)(separator.data + lVar12 + -8);
              sVar20 = BinaryLambdaWrapper::
                       Operation<duckdb::ParseDirpathFunction(duckdb::DataChunk&,duckdb::ExpressionState&,duckdb::Vector&)::__0,bool,duckdb::string_t,duckdb::string_t,duckdb::string_t>
                                 ((anon_class_8_1_6971b95b)result,sVar20,right_06,in_R9,count);
              *(long *)(pdVar4 + lVar12 + -8) = sVar20.value._0_8_;
              *(long *)(pdVar4 + lVar12) = sVar20.value._8_8_;
              lVar12 = lVar12 + 0x10;
            }
          }
          else {
            uVar6 = count + 0x3f;
            uVar17 = 0;
            for (uVar9 = 0; uVar9 != uVar6 >> 6; uVar9 = uVar9 + 1) {
              puVar2 = (this->super_TemplatedValidityMask<unsigned_long>).validity_mask;
              if (puVar2 == (unsigned_long *)0x0) {
                uVar13 = uVar17 + 0x40;
                if (count <= uVar17 + 0x40) {
                  uVar13 = count;
                }
LAB_00d55e14:
                uVar10 = uVar17 << 4 | 8;
                for (; uVar7 = uVar17, uVar17 < uVar13; uVar17 = uVar17 + 1) {
                  left_03.value.pointer.ptr = (char *)*(undefined8 *)(pdVar16 + uVar10);
                  left_03.value._0_8_ = *(undefined8 *)(pdVar16 + (uVar10 - 8));
                  right_02.value.pointer.ptr = (char *)*(undefined8 *)(separator.data + uVar10);
                  right_02.value._0_8_ = *(undefined8 *)(separator.data + (uVar10 - 8));
                  sVar20 = BinaryLambdaWrapper::
                           Operation<duckdb::ParseDirpathFunction(duckdb::DataChunk&,duckdb::ExpressionState&,duckdb::Vector&)::__0,bool,duckdb::string_t,duckdb::string_t,duckdb::string_t>
                                     ((anon_class_8_1_6971b95b)result,left_03,right_02,in_R9,count);
                  *(long *)(pdVar4 + (uVar10 - 8)) = sVar20.value._0_8_;
                  *(long *)(pdVar4 + uVar10) = sVar20.value._8_8_;
                  uVar10 = uVar10 + 0x10;
                }
              }
              else {
                uVar10 = puVar2[uVar9];
                uVar13 = uVar17 + 0x40;
                if (count <= uVar17 + 0x40) {
                  uVar13 = count;
                }
                if (uVar10 == 0xffffffffffffffff) goto LAB_00d55e14;
                uVar7 = uVar13;
                if (uVar10 != 0) {
                  uVar15 = uVar17 << 4 | 8;
                  for (uVar11 = 0; uVar7 = uVar17 + uVar11, uVar17 + uVar11 < uVar13;
                      uVar11 = uVar11 + 1) {
                    if ((uVar10 >> (uVar11 & 0x3f) & 1) != 0) {
                      left_04.value.pointer.ptr = (char *)*(undefined8 *)(pdVar16 + uVar15);
                      left_04.value._0_8_ = *(undefined8 *)(pdVar16 + (uVar15 - 8));
                      right_03.value.pointer.ptr = (char *)*(undefined8 *)(separator.data + uVar15);
                      right_03.value._0_8_ = *(undefined8 *)(separator.data + (uVar15 - 8));
                      sVar20 = BinaryLambdaWrapper::
                               Operation<duckdb::ParseDirpathFunction(duckdb::DataChunk&,duckdb::ExpressionState&,duckdb::Vector&)::__0,bool,duckdb::string_t,duckdb::string_t,duckdb::string_t>
                                         ((anon_class_8_1_6971b95b)result,left_04,right_03,in_R9,
                                          count);
                      *(long *)(pdVar4 + (uVar15 - 8)) = sVar20.value._0_8_;
                      *(long *)(pdVar4 + uVar15) = sVar20.value._8_8_;
                    }
                    uVar15 = uVar15 + 0x10;
                  }
                }
              }
              uVar17 = uVar7;
            }
          }
        }
        else {
          UnifiedVectorFormat::UnifiedVectorFormat(&ldata);
          UnifiedVectorFormat::UnifiedVectorFormat(&local_f0);
          Vector::ToUnifiedFormat(vector,count,&ldata);
          Vector::ToUnifiedFormat(&separator,count,&local_f0);
          Vector::SetVectorType(result,FLAT_VECTOR);
          pdVar16 = result->data;
          plVar5 = (long *)CONCAT71(ldata.sel._1_7_,ldata.sel._0_1_);
          FlatVector::VerifyFlatVector(result);
          if (local_f0.validity.super_TemplatedValidityMask<unsigned_long>.validity_mask ==
              (unsigned_long *)0x0 &&
              ldata.validity.super_TemplatedValidityMask<unsigned_long>.validity_mask ==
              (unsigned_long *)0x0) {
            pdVar16 = pdVar16 + 8;
            for (uVar17 = 0; count != uVar17; uVar17 = uVar17 + 1) {
              lVar12 = *plVar5;
              uVar6 = uVar17;
              if (lVar12 != 0) {
                uVar6 = (ulong)*(uint *)(lVar12 + uVar17 * 4);
              }
              uVar9 = uVar17;
              if ((local_f0.sel)->sel_vector != (sel_t *)0x0) {
                uVar9 = (ulong)(local_f0.sel)->sel_vector[uVar17];
              }
              left_01.value.pointer.ptr = (char *)*(undefined8 *)(ldata.data + uVar6 * 0x10 + 8);
              left_01.value._0_8_ = *(undefined8 *)(ldata.data + uVar6 * 0x10);
              right.value.pointer.ptr = (char *)*(undefined8 *)(local_f0.data + uVar9 * 0x10 + 8);
              right.value._0_8_ = *(undefined8 *)(local_f0.data + uVar9 * 0x10);
              sVar20 = BinaryLambdaWrapper::
                       Operation<duckdb::ParseDirpathFunction(duckdb::DataChunk&,duckdb::ExpressionState&,duckdb::Vector&)::__0,bool,duckdb::string_t,duckdb::string_t,duckdb::string_t>
                                 ((anon_class_8_1_6971b95b)result,left_01,right,in_R9,count);
              *(long *)(pdVar16 + -8) = sVar20.value._0_8_;
              *(long *)pdVar16 = sVar20.value._8_8_;
              pdVar16 = pdVar16 + 0x10;
            }
          }
          else {
            pdVar16 = pdVar16 + 8;
            for (row_idx = 0; count != row_idx; row_idx = row_idx + 1) {
              lVar12 = *plVar5;
              iVar8 = row_idx;
              if (lVar12 != 0) {
                iVar8 = (idx_t)*(uint *)(lVar12 + row_idx * 4);
              }
              iVar14 = row_idx;
              if ((local_f0.sel)->sel_vector != (sel_t *)0x0) {
                iVar14 = (idx_t)(local_f0.sel)->sel_vector[row_idx];
              }
              if (((ldata.validity.super_TemplatedValidityMask<unsigned_long>.validity_mask ==
                    (unsigned_long *)0x0) ||
                  ((ldata.validity.super_TemplatedValidityMask<unsigned_long>.validity_mask
                    [iVar8 >> 6] >> (iVar8 & 0x3f) & 1) != 0)) &&
                 ((local_f0.validity.super_TemplatedValidityMask<unsigned_long>.validity_mask ==
                   (unsigned_long *)0x0 ||
                  ((local_f0.validity.super_TemplatedValidityMask<unsigned_long>.validity_mask
                    [iVar14 >> 6] >> (iVar14 & 0x3f) & 1) != 0)))) {
                left_05.value.pointer.ptr = (char *)*(undefined8 *)(ldata.data + iVar8 * 0x10 + 8);
                left_05.value._0_8_ = *(undefined8 *)(ldata.data + iVar8 * 0x10);
                right_04.value.pointer.ptr =
                     (char *)*(undefined8 *)(local_f0.data + iVar14 * 0x10 + 8);
                right_04.value._0_8_ = *(undefined8 *)(local_f0.data + iVar14 * 0x10);
                sVar20 = BinaryLambdaWrapper::
                         Operation<duckdb::ParseDirpathFunction(duckdb::DataChunk&,duckdb::ExpressionState&,duckdb::Vector&)::__0,bool,duckdb::string_t,duckdb::string_t,duckdb::string_t>
                                   ((anon_class_8_1_6971b95b)result,left_05,right_04,in_R9,count);
                *(long *)(pdVar16 + -8) = sVar20.value._0_8_;
                *(long *)pdVar16 = sVar20.value._8_8_;
              }
              else {
                TemplatedValidityMask<unsigned_long>::SetInvalid
                          (&(result->validity).super_TemplatedValidityMask<unsigned_long>,row_idx);
              }
              pdVar16 = pdVar16 + 0x10;
            }
          }
          UnifiedVectorFormat::~UnifiedVectorFormat(&local_f0);
          UnifiedVectorFormat::~UnifiedVectorFormat(&ldata);
        }
        goto LAB_00d55a62;
      }
      paVar3 = (anon_union_16_2_67f50693_for_value *)vector->data;
      puVar2 = (vector->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask;
      if ((puVar2 == (unsigned_long *)0x0) || ((*puVar2 & 1) != 0)) {
        Vector::SetVectorType(result,FLAT_VECTOR);
        pdVar16 = result->data;
        FlatVector::VerifyFlatVector(result);
        FlatVector::VerifyFlatVector(&separator);
        FlatVector::SetValidity(result,&separator.validity);
        if ((result->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask ==
            (unsigned_long *)0x0) {
          lVar12 = 8;
          while (bVar18 = count != 0, count = count - 1, bVar18) {
            right_05.value.pointer.ptr = (char *)*(undefined8 *)(separator.data + lVar12);
            right_05.value._0_8_ = *(undefined8 *)(separator.data + lVar12 + -8);
            sVar20 = BinaryLambdaWrapper::
                     Operation<duckdb::ParseDirpathFunction(duckdb::DataChunk&,duckdb::ExpressionState&,duckdb::Vector&)::__0,bool,duckdb::string_t,duckdb::string_t,duckdb::string_t>
                               ((anon_class_8_1_6971b95b)result,(string_t)paVar3->pointer,right_05,
                                in_R9,count);
            *(long *)(pdVar16 + lVar12 + -8) = sVar20.value._0_8_;
            *(long *)(pdVar16 + lVar12) = sVar20.value._8_8_;
            lVar12 = lVar12 + 0x10;
          }
        }
        else {
          uVar6 = count + 0x3f;
          uVar17 = 0;
          for (uVar9 = 0; uVar9 != uVar6 >> 6; uVar9 = uVar9 + 1) {
            puVar2 = (result->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask;
            if (puVar2 == (unsigned_long *)0x0) {
              uVar13 = uVar17 + 0x40;
              if (count <= uVar17 + 0x40) {
                uVar13 = count;
              }
LAB_00d55c36:
              uVar10 = uVar17 << 4 | 8;
              for (; uVar7 = uVar17, uVar17 < uVar13; uVar17 = uVar17 + 1) {
                right_00.value.pointer.ptr = (char *)*(undefined8 *)(separator.data + uVar10);
                right_00.value._0_8_ = *(undefined8 *)(separator.data + (uVar10 - 8));
                sVar20 = BinaryLambdaWrapper::
                         Operation<duckdb::ParseDirpathFunction(duckdb::DataChunk&,duckdb::ExpressionState&,duckdb::Vector&)::__0,bool,duckdb::string_t,duckdb::string_t,duckdb::string_t>
                                   ((anon_class_8_1_6971b95b)result,(string_t)paVar3->pointer,
                                    right_00,in_R9,count);
                *(long *)(pdVar16 + (uVar10 - 8)) = sVar20.value._0_8_;
                *(long *)(pdVar16 + uVar10) = sVar20.value._8_8_;
                uVar10 = uVar10 + 0x10;
              }
            }
            else {
              uVar10 = puVar2[uVar9];
              uVar13 = uVar17 + 0x40;
              if (count <= uVar17 + 0x40) {
                uVar13 = count;
              }
              if (uVar10 == 0xffffffffffffffff) goto LAB_00d55c36;
              uVar7 = uVar13;
              if (uVar10 != 0) {
                uVar11 = uVar17 << 4 | 8;
                for (uVar15 = 0; uVar7 = uVar17 + uVar15, uVar17 + uVar15 < uVar13;
                    uVar15 = uVar15 + 1) {
                  if ((uVar10 >> (uVar15 & 0x3f) & 1) != 0) {
                    right_01.value.pointer.ptr = (char *)*(undefined8 *)(separator.data + uVar11);
                    right_01.value._0_8_ = *(undefined8 *)(separator.data + (uVar11 - 8));
                    sVar20 = BinaryLambdaWrapper::
                             Operation<duckdb::ParseDirpathFunction(duckdb::DataChunk&,duckdb::ExpressionState&,duckdb::Vector&)::__0,bool,duckdb::string_t,duckdb::string_t,duckdb::string_t>
                                       ((anon_class_8_1_6971b95b)result,(string_t)paVar3->pointer,
                                        right_01,in_R9,count);
                    *(long *)(pdVar16 + (uVar11 - 8)) = sVar20.value._0_8_;
                    *(long *)(pdVar16 + uVar11) = sVar20.value._8_8_;
                  }
                  uVar11 = uVar11 + 0x10;
                }
              }
            }
            uVar17 = uVar7;
          }
        }
        goto LAB_00d55a62;
      }
    }
    Vector::SetVectorType(result,CONSTANT_VECTOR);
  }
  ConstantVector::SetNull(result,true);
LAB_00d55a62:
  Vector::~Vector(&trim_extension);
  Vector::~Vector(&separator);
  return;
}

Assistant:

static void ParseDirpathFunction(DataChunk &args, ExpressionState &state, Vector &result) {
	// set default values
	Vector &path = args.data[0];
	Vector separator(string_t("default"));
	Vector trim_extension(false);
	ReadOptionalArgs(args, separator, trim_extension, true);

	BinaryExecutor::Execute<string_t, string_t, string_t>(
	    path, separator, result, args.size(), [&](string_t input_path, string_t input_sep) {
		    auto path = input_path.GetData();
		    auto path_size = input_path.GetSize();
		    auto sep = GetSeparator(input_sep.GetString());

		    auto last_sep = FindLast(path, path_size, sep);
		    if (last_sep == 0 && path_size == 1) {
			    last_sep = 1;
		    }
		    idx_t new_size = (IsIdxValid(last_sep, path_size)) ? last_sep : 0;

		    auto target = StringVector::EmptyString(result, new_size);
		    auto output = target.GetDataWriteable();
		    memcpy(output, path, new_size);
		    target.Finalize();
		    return StringVector::AddString(result, target);
	    });
}